

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlParseStartTag(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined *in_RAX;
  xmlChar *str;
  PyObject *pPVar2;
  undefined8 uVar3;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  local_18 = in_RAX;
  iVar1 = libxml_deprecationWarning("xmlParseStartTag");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlParseStartTag",&local_18);
    if (iVar1 != 0) {
      if (local_18 == &_Py_NoneStruct) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(local_18 + 0x10);
      }
      str = (xmlChar *)xmlParseStartTag(uVar3);
      pPVar2 = libxml_xmlCharPtrConstWrap(str);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlParseStartTag(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    const xmlChar * c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (libxml_deprecationWarning("xmlParseStartTag") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"O:xmlParseStartTag", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlParseStartTag(ctxt);
    py_retval = libxml_xmlCharPtrConstWrap((const xmlChar *) c_retval);
    return(py_retval);
}